

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Value * __thiscall
soul::heart::Parser::parseAnnotationValue(Value *__return_storage_ptr__,Parser *this)

{
  double dVar1;
  ProgramImpl *pPVar2;
  int64_t iVar3;
  bool bVar4;
  Handle h;
  CompileMessage local_d0;
  Value local_98;
  CompileMessage local_58;
  
  bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,(TokenType)0x2a3459);
  if (bVar4) {
    iVar3 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    soul::Value::Value(__return_storage_ptr__,(int32_t)iVar3);
  }
  else {
    bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)0x2a3464);
    if (bVar4) {
      iVar3 = (this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).literalIntValue;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      soul::Value::Value(__return_storage_ptr__,iVar3);
    }
    else {
      bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,(TokenType)0x2a3507);
      if (bVar4) {
        dVar1 = (this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).literalDoubleValue;
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              );
        soul::Value::Value(__return_storage_ptr__,(float)dVar1);
      }
      else {
        bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matches(&this->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ,(TokenType)0x2a34fe);
        if (bVar4) {
          dVar1 = (this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ).literalDoubleValue;
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
          soul::Value::Value(__return_storage_ptr__,dVar1);
        }
        else {
          bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matches(&this->
                             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ,(TokenType)0x2a34c2);
          if (bVar4) {
            pPVar2 = (this->program).pimpl;
            h.handle = (*(pPVar2->stringDictionary).super_StringDictionary._vptr_StringDictionary[2]
                       )(&pPVar2->stringDictionary,
                         (this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ).currentStringValue._M_string_length,
                         (this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ).currentStringValue._M_dataplus._M_p);
            Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::skip(&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  );
            soul::Value::createStringLiteral(__return_storage_ptr__,h);
          }
          else {
            bVar4 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                    ::matchIf<char_const*>
                              ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                *)this,"true");
            if (bVar4) {
              bVar4 = true;
            }
            else {
              bVar4 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      ::matchIf<char_const*>
                                ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                  *)this,"false");
              if (!bVar4) {
                bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ::matchIf<soul::TokenType>
                                  (&this->
                                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                   ,(TokenType)0x2c42ab);
                if (bVar4) {
                  parseAnnotationValue(&local_98,this);
                  negate(__return_storage_ptr__,this,&local_98);
                  soul::Value::~Value(&local_98);
                  return __return_storage_ptr__;
                }
                bVar4 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ::matches(&this->
                                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                  ,(TokenType)0x2a3312);
                if (!bVar4) {
                  parseNaNandInfinityTokens(__return_storage_ptr__,this);
                  if ((__return_storage_ptr__->type).category != invalid) {
                    return __return_storage_ptr__;
                  }
                  Errors::missingAnnotationValue<>();
                  CodeLocation::throwError
                            (&(this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              ).location,&local_d0);
                }
                Errors::propertyMustBeConstant<>();
                CodeLocation::throwError
                          (&(this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ).location,&local_58);
              }
              bVar4 = false;
            }
            soul::Value::Value(__return_storage_ptr__,bVar4);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value parseAnnotationValue()
    {
        if (matches (Token::literalInt32))       { auto v = literalIntValue;    skip(); return Value::createInt32 (v); }
        if (matches (Token::literalInt64))       { auto v = literalIntValue;    skip(); return Value::createInt64 (v); }
        if (matches (Token::literalFloat32))     { auto v = literalDoubleValue; skip(); return Value ((float) v); }
        if (matches (Token::literalFloat64))     { auto v = literalDoubleValue; skip(); return Value (v); }
        if (matches (Token::literalString))      { auto v = program.getStringDictionary().getHandleForString (currentStringValue); skip(); return Value::createStringLiteral(v); }
        if (matchIf ("true"))                    { return Value (true); }
        if (matchIf ("false"))                   { return Value (false); }
        if (matchIf (HEARTOperator::minus))      { return negate (parseAnnotationValue()); }
        if (matches (Token::variableIdentifier)) { location.throwError (Errors::propertyMustBeConstant()); }

        auto infOrNaN = parseNaNandInfinityTokens();

        if (infOrNaN.isValid())
            return infOrNaN;

        location.throwError (Errors::missingAnnotationValue());
    }